

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O3

size_t ggml_hash_find_or_insert(ggml_hash_set *hash_set,ggml_tensor *key)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = ((ulong)key >> 4) % hash_set->size;
  uVar2 = uVar3;
  while( true ) {
    uVar1 = hash_set->used[uVar2 >> 5];
    if ((uVar1 >> ((uint)uVar2 & 0x1f) & 1) == 0) {
      hash_set->used[uVar2 >> 5] = 1 << ((byte)uVar2 & 0x1f) | uVar1;
      hash_set->keys[uVar2] = key;
      return uVar2;
    }
    if (hash_set->keys[uVar2] == key) break;
    uVar2 = uVar2 + 1;
    if (uVar2 == hash_set->size) {
      uVar2 = 0;
    }
    if (uVar2 == uVar3) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-impl.h"
                 ,0x11a,"fatal error");
    }
  }
  return uVar2;
}

Assistant:

static size_t ggml_hash_find_or_insert(struct ggml_hash_set * hash_set, struct ggml_tensor * key) {
    size_t h = ggml_hash(key) % hash_set->size;

    // linear probing
    size_t i = h;
    do {
        if (!ggml_bitset_get(hash_set->used, i)) {
            ggml_bitset_set(hash_set->used, i);
            hash_set->keys[i] = key;
            return i;
        }
        if (hash_set->keys[i] == key) {
            return i;
        }
        i = (i + 1) % hash_set->size;
    } while (i != h);

    // visited all hash table entries -> not found
    GGML_ABORT("fatal error");
}